

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer_n.c
# Opt level: O0

void dump_symbol_name_list(TextBuffer *buf,LuaSymbolList *list,int level,char *delimiter)

{
  undefined1 local_50 [8];
  PtrListIterator nodeiter__;
  LuaSymbol *pLStack_30;
  _Bool is_first;
  LuaSymbol *node;
  char *delimiter_local;
  int level_local;
  LuaSymbolList *list_local;
  TextBuffer *buf_local;
  
  nodeiter__._23_1_ = 1;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_50,(PtrList *)list);
  pLStack_30 = (LuaSymbol *)raviX_ptrlist_iter_next((PtrListIterator *)local_50);
  while (pLStack_30 != (LuaSymbol *)0x0) {
    if (((nodeiter__._23_1_ & 1) == 0) && (delimiter != (char *)0x0)) {
      printf_buf(buf,"%p%s",(ulong)(uint)level,delimiter);
    }
    else {
      printf_buf(buf,"%p",(ulong)(uint)level);
      nodeiter__._23_1_ = 0;
    }
    dump_symbol_name(buf,pLStack_30);
    printf_buf(buf,"\n");
    pLStack_30 = (LuaSymbol *)raviX_ptrlist_iter_next((PtrListIterator *)local_50);
  }
  return;
}

Assistant:

static void dump_symbol_name_list(TextBuffer *buf, LuaSymbolList *list, int level, const char *delimiter)
{
	LuaSymbol *node;
	bool is_first = true;
	FOR_EACH_PTR(list, LuaSymbol, node)
	{
		if (is_first || !delimiter) {
			printf_buf(buf, "%p", level);
			is_first = false;
		}
		else {
			printf_buf(buf, "%p%s", level, delimiter);
		}
		dump_symbol_name(buf, node);
		printf_buf(buf, "\n");
	}
	END_FOR_EACH_PTR(node);
}